

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O1

bool __thiscall
gui::DrawWindow(gui *this,IFrameBuffer *fb,TRect client,CWindow *wnd,bool parentDirty)

{
  TPoint TVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  TPoint this_01;
  byte bVar3;
  _List_node_base *p_Var4;
  TRect client_00;
  int y;
  int x;
  CClippedFrameBuffer cfb;
  TRect thisRect;
  CTranslatedFrameBuffer tfb;
  int local_a8;
  int local_a4;
  TRect local_a0;
  TPoint local_90;
  undefined **local_88;
  TPoint local_80;
  TPoint local_78;
  gui *local_70;
  TRect local_68;
  undefined **local_58;
  TPoint local_50;
  TPoint local_48;
  undefined ***local_40;
  
  this_01 = client.p1;
  local_a0.p1 = client.p0;
  if (*(bool *)((long)this_01 + 0x750) == true) {
    local_a0.p0 = (TPoint)fb;
    CWindow::GetAbsoluteCoords((CWindow *)this_01,&local_a4,&local_a8);
    local_88 = &PTR___cxa_pure_virtual_00138538;
    local_80 = local_a0.p0;
    local_78 = local_a0.p1;
    if ((local_a0.p1.x < local_a0.p0.x) || (local_a0.p1.y < local_a0.p0.y)) {
LAB_001203ed:
      __assert_fail("rect.Valid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vitalych[P]GUI/src/Framebuffer.h"
                    ,100,"gui::CFrameBufferBase::CFrameBufferBase(TRect)");
    }
    local_88 = &PTR_DrawRect_001386f8;
    local_58 = &PTR___cxa_pure_virtual_00138538;
    local_50 = local_a0.p0;
    local_48 = local_a0.p1;
    local_70 = this;
    if ((local_a0.p1.x < local_a0.p0.x) || (local_a0.p1.y < local_a0.p0.y)) goto LAB_001203ed;
    local_58 = &PTR_DrawRect_00138750;
    local_40 = &local_88;
    bVar3 = (byte)wnd | *(bool *)((long)this_01 + 0x759);
    if (bVar3 == 1) {
      (**(code **)(*(long *)this_01 + 0x40))(this_01,&local_58);
    }
    local_68.p1.x =
         (((TPoint *)((long)this_01 + 0x720))->x + local_a4) -
         (((TRect *)((long)this_01 + 0x718))->p0).x;
    local_68.p1.y = (*(int *)((long)this_01 + 0x724) + local_a8) - *(int *)((long)this_01 + 0x71c);
    local_68.p0.x = local_a4;
    local_68.p0.y = local_a8;
    bVar2 = TRect::ClipRect(&local_a0,&local_68);
    if (bVar2) {
      local_90 = this_01;
      for (p_Var4 = (((Children *)((long)this_01 + 0x738))->
                    super__List_base<std::shared_ptr<gui::CWindow>,_std::allocator<std::shared_ptr<gui::CWindow>_>_>
                    )._M_impl._M_node.super__List_node_base._M_next;
          p_Var4 != (_List_node_base *)((long)this_01 + 0x738); p_Var4 = p_Var4->_M_next) {
        TVar1 = (TPoint)p_Var4[1]._M_next;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_prev;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        client_00.p0.y = local_68.p1.y;
        client_00.p0.x = local_68.p1.x;
        client_00.p1 = TVar1;
        bVar2 = DrawWindow(this,(IFrameBuffer *)CONCAT44(local_68.p0.y,local_68.p0.x),client_00,
                           (CWindow *)(ulong)(bVar3 & 1),parentDirty);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        bVar3 = bVar3 | bVar2;
      }
      *(bool *)((long)local_90 + 0x759) = false;
      goto LAB_001203d9;
    }
  }
  bVar3 = 0;
LAB_001203d9:
  return (bool)(bVar3 & 1);
}

Assistant:

bool DrawWindow(IFrameBuffer &fb, TRect client, CWindow &wnd, bool parentDirty) {
    if (!wnd.Visible()) {
        return false;
    }

    int x, y;
    wnd.GetAbsoluteCoords(x, y);

    CClippedFrameBuffer cfb(fb, client);
    CTranslatedFrameBuffer tfb(cfb, TPoint(x, y));

    auto dirty = wnd.IsDirty() || parentDirty;
    if (dirty) {
        wnd.Draw(tfb);
    }

    auto thisRect = TRect(x, y, x + wnd.GetWidth() - 1, y + wnd.GetHeight() - 1);
    if (!client.ClipRect(thisRect)) {
        return false;
    }

    for (auto child : wnd.GetChildren()) {
        dirty |= DrawWindow(fb, thisRect, *child.get(), dirty);
    }

    wnd.SetDirty(false);
    return dirty;
}